

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Param::Param
          (Param *this,Generator *m,shared_ptr<kratos::Param> *param,string *parameter_name)

{
  element_type *peVar1;
  string *parameter_name_local;
  shared_ptr<kratos::Param> *param_local;
  Generator *m_local;
  Param *this_local;
  
  Const::Const(&this->super_Const,m,1,1,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0058bba0;
  std::__cxx11::string::string((string *)&this->parameter_name_,(string *)parameter_name);
  peVar1 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)param);
  this->param_type_ = peVar1->param_type_;
  std::
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  ::unordered_set(&this->param_vars_width_);
  std::
  set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
  ::set(&this->param_vars_size_);
  std::
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  ::unordered_set(&this->param_params_);
  this->parent_param_ = (Param *)0x0;
  this->has_value_ = false;
  std::optional<long>::optional(&this->initial_value_);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->raw_str_value_);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->initial_raw_str_value_);
  peVar1 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)param);
  this->enum_def_ = peVar1->enum_def_;
  return;
}

Assistant:

Param::Param(Generator *m, const std::shared_ptr<Param> &param, std::string parameter_name)
    : Const(m, 1, 1, false),
      parameter_name_(std::move(parameter_name)),
      param_type_(param->param_type_),
      enum_def_(param->enum_def_) {}